

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O3

void refineBasis(HighsLp *lp,HighsSolution *solution,HighsBasis *basis)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  HighsBasisStatus HVar8;
  pointer pHVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  bVar3 = solution->value_valid;
  iVar4 = lp->num_col_;
  uVar5 = lp->num_row_;
  if (0 < (long)iVar4) {
    pHVar9 = (basis->col_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      if (pHVar9[lVar10] == kNonbasic) {
        dVar12 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
        dVar2 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        if ((dVar12 != dVar2) || (NAN(dVar12) || NAN(dVar2))) {
          bVar6 = highs_isInfinity(-dVar12);
          bVar7 = highs_isInfinity(dVar2);
          if (bVar6) {
            HVar8 = bVar7 | kUpper;
          }
          else {
            if (bVar7) goto LAB_002557d0;
            if (bVar3 == false) {
              bVar6 = ABS(dVar2) == ABS(dVar12);
              bVar7 = ABS(dVar2) < ABS(dVar12);
            }
            else {
              dVar12 = (dVar12 + dVar2) * 0.5;
              pdVar1 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar10;
              bVar6 = dVar12 == *pdVar1;
              bVar7 = dVar12 < *pdVar1;
            }
            HVar8 = (bVar7 || bVar6) * '\x02';
          }
        }
        else {
LAB_002557d0:
          HVar8 = kLower;
        }
        pHVar9 = (basis->col_status).
                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pHVar9[lVar10] = HVar8;
      }
      lVar10 = lVar10 + 1;
    } while (iVar4 != lVar10);
  }
  if (0 < (int)uVar5) {
    pHVar9 = (basis->row_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      if (pHVar9[uVar11] == kNonbasic) {
        dVar12 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11];
        dVar2 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11];
        if ((dVar12 != dVar2) || (NAN(dVar12) || NAN(dVar2))) {
          bVar6 = highs_isInfinity(-dVar12);
          bVar7 = highs_isInfinity(dVar2);
          if (bVar6) {
            HVar8 = bVar7 | kUpper;
          }
          else {
            if (bVar7) goto LAB_002558a6;
            if (bVar3 == false) {
              bVar6 = ABS(dVar2) == ABS(dVar12);
              bVar7 = ABS(dVar2) < ABS(dVar12);
            }
            else {
              dVar12 = (dVar12 + dVar2) * 0.5;
              pdVar1 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar11;
              bVar6 = dVar12 == *pdVar1;
              bVar7 = dVar12 < *pdVar1;
            }
            HVar8 = (bVar7 || bVar6) * '\x02';
          }
        }
        else {
LAB_002558a6:
          HVar8 = kLower;
        }
        pHVar9 = (basis->row_status).
                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pHVar9[uVar11] = HVar8;
      }
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
  }
  return;
}

Assistant:

void refineBasis(const HighsLp& lp, const HighsSolution& solution,
                 HighsBasis& basis) {
  assert(basis.useful);
  assert(isBasisRightSize(lp, basis));
  const bool have_highs_solution = solution.value_valid;

  const HighsInt num_col = lp.num_col_;
  const HighsInt num_row = lp.num_row_;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (basis.col_status[iCol] != HighsBasisStatus::kNonbasic) continue;
    const double lower = lp.col_lower_[iCol];
    const double upper = lp.col_upper_[iCol];
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    if (lower == upper) {
      status = HighsBasisStatus::kLower;
    } else if (!highs_isInfinity(-lower)) {
      if (!highs_isInfinity(upper)) {
        if (have_highs_solution) {
          if (solution.col_value[iCol] < 0.5 * (lower + upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        } else {
          if (fabs(lower) < fabs(upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        }
      } else {
        status = HighsBasisStatus::kLower;
      }
    } else if (!highs_isInfinity(upper)) {
      status = HighsBasisStatus::kUpper;
    } else {
      status = HighsBasisStatus::kZero;
    }
    assert(status != HighsBasisStatus::kNonbasic);
    basis.col_status[iCol] = status;
  }

  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (basis.row_status[iRow] != HighsBasisStatus::kNonbasic) continue;
    const double lower = lp.row_lower_[iRow];
    const double upper = lp.row_upper_[iRow];
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    if (lower == upper) {
      status = HighsBasisStatus::kLower;
    } else if (!highs_isInfinity(-lower)) {
      if (!highs_isInfinity(upper)) {
        if (have_highs_solution) {
          if (solution.row_value[iRow] < 0.5 * (lower + upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        } else {
          if (fabs(lower) < fabs(upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        }
      } else {
        status = HighsBasisStatus::kLower;
      }
    } else if (!highs_isInfinity(upper)) {
      status = HighsBasisStatus::kUpper;
    } else {
      status = HighsBasisStatus::kZero;
    }
    assert(status != HighsBasisStatus::kNonbasic);
    basis.row_status[iRow] = status;
  }
}